

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  long lVar1;
  MemPage *pPage;
  CellInfo *pCVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uchar *pBuf;
  int iVar7;
  byte *pbVar8;
  byte *pKey1;
  u32 uVar9;
  uint uVar10;
  ulong in_R9;
  int iVar11;
  bool bVar12;
  u32 dummy;
  i64 nCellKey;
  int local_70;
  u32 local_4c;
  u64 local_48;
  CellInfo *local_40;
  u64 local_38;
  
  if (((pCur->eState == '\x01') && (pCur->validNKey != '\0')) && (pCur->apPage[0]->intKey != '\0'))
  {
    iVar4 = 0;
    lVar1 = (pCur->info).nKey;
    if ((lVar1 == intKey) || ((lVar1 < intKey && (iVar4 = -1, pCur->atLast != '\0'))))
    goto LAB_0016c0fc;
  }
  local_48 = intKey;
  iVar4 = moveToRoot(pCur);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (pCur->eState != '\0') {
    local_40 = &pCur->info;
    local_70 = 0;
    do {
      pPage = pCur->apPage[pCur->iPage];
      iVar7 = pPage->nCell - 1;
      iVar4 = (int)(((uint)pPage->nCell - (iVar7 >> 0x1f)) + -1) >> 1;
      if (biasRight != 0) {
        iVar4 = iVar7;
      }
      pCur->aiIdx[pCur->iPage] = (u16)iVar4;
      iVar5 = 0;
      do {
        pCVar2 = local_40;
        (pCur->info).nSize = 0;
        pbVar8 = pPage->aData +
                 (CONCAT11(pPage->aCellIdx[(long)iVar4 * 2],pPage->aCellIdx[(long)iVar4 * 2 + 1]) &
                 pPage->maskPage) + pPage->childPtrSize;
        if (pPage->intKey == '\0') {
          bVar3 = *pbVar8;
          uVar10 = (uint)bVar3;
          pKey1 = pbVar8 + 1;
          if (pPage->max1bytePayload < bVar3) {
            if ((-1 < (char)*pKey1) &&
               (uVar10 = (bVar3 & 0x7f) << 7 | (int)(char)*pKey1, uVar10 <= pPage->maxLocal)) {
              pKey1 = pbVar8 + 2;
              goto LAB_0016bf4e;
            }
            btreeParseCellPtr(pPage,pPage->aData +
                                    (CONCAT11(pPage->aCellIdx[(long)iVar4 * 2],
                                              pPage->aCellIdx[(long)iVar4 * 2 + 1]) &
                                    pPage->maskPage),local_40);
            uVar9 = (u32)pCVar2->nKey;
            pBuf = (uchar *)sqlite3Malloc(uVar9);
            iVar11 = 6;
            if (pBuf == (uchar *)0x0) {
              local_70 = 7;
LAB_0016bf6a:
              bVar12 = false;
              in_R9 = in_R9 & 0xffffffff;
            }
            else {
              local_70 = accessPayload(pCur,0,uVar9,pBuf,0);
              if (local_70 != 0) {
                sqlite3_free(pBuf);
                goto LAB_0016bf6a;
              }
              uVar10 = sqlite3VdbeRecordCompare(uVar9,pBuf,pIdxKey);
              sqlite3_free(pBuf);
              in_R9 = (ulong)uVar10;
              iVar11 = 0;
              bVar12 = true;
              local_70 = 0;
            }
          }
          else {
LAB_0016bf4e:
            uVar10 = sqlite3VdbeRecordCompare(uVar10,pKey1,pIdxKey);
            in_R9 = (ulong)uVar10;
            iVar11 = 0;
            bVar12 = true;
          }
          if (bVar12) goto LAB_0016bfaa;
        }
        else {
          if (pPage->hasData != '\0') {
            if ((char)*pbVar8 < '\0') {
              bVar3 = sqlite3GetVarint32(pbVar8,&local_4c);
              uVar6 = (ulong)bVar3;
            }
            else {
              uVar6 = 1;
              local_4c = (int)(char)*pbVar8;
            }
            pbVar8 = pbVar8 + uVar6;
          }
          sqlite3GetVarint(pbVar8,&local_38);
          uVar10 = (((long)local_48 <= (long)local_38) - 1) +
                   (uint)((long)local_48 <= (long)local_38);
          if (local_38 == local_48) {
            uVar10 = 0;
          }
          in_R9 = (ulong)uVar10;
          pCur->validNKey = '\x01';
          (pCur->info).nKey = local_38;
LAB_0016bfaa:
          if ((int)in_R9 == 0) {
            if ((pPage->intKey == '\0') || (pPage->leaf != '\0')) {
              *pRes = 0;
              in_R9 = 0;
              iVar11 = 6;
              local_70 = 0;
            }
            else {
              in_R9 = 0;
              iVar11 = 4;
              iVar5 = iVar4;
            }
          }
          else {
            if ((int)in_R9 < 0) {
              iVar5 = iVar4 + 1;
            }
            else {
              iVar7 = iVar4 + -1;
            }
            iVar11 = 4;
            if (iVar5 <= iVar7) {
              iVar4 = (iVar5 + iVar7) / 2;
              pCur->aiIdx[pCur->iPage] = (u16)iVar4;
              iVar11 = 0;
            }
          }
        }
      } while (iVar11 == 0);
      if (iVar11 == 4) {
        uVar9 = 0;
        if (pPage->leaf == '\0') {
          if (iVar5 < (int)(uint)pPage->nCell) {
            lVar1 = (ulong)(CONCAT11(pPage->aCellIdx[(long)iVar5 * 2],
                                     pPage->aCellIdx[(long)iVar5 * 2 + 1]) & pPage->maskPage) + 3;
          }
          else {
            lVar1 = (ulong)pPage->hdrOffset + 0xb;
          }
          pbVar8 = pPage->aData + lVar1;
          uVar9 = (uint)*pbVar8 |
                  (uint)pbVar8[-1] << 8 | (uint)pbVar8[-2] << 0x10 | (uint)pbVar8[-3] << 0x18;
        }
        if (uVar9 == 0) {
          *pRes = (int)in_R9;
          bVar12 = false;
          local_70 = 0;
        }
        else {
          pCur->aiIdx[pCur->iPage] = (u16)iVar5;
          (pCur->info).nSize = 0;
          pCur->validNKey = '\0';
          local_70 = moveToChild(pCur,uVar9);
          bVar12 = local_70 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if (!bVar12) {
        return local_70;
      }
    } while( true );
  }
  iVar4 = -1;
LAB_0016c0fc:
  *pRes = iVar4;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorHoldsMutex(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && pCur->validNKey 
   && pCur->apPage[0]->intKey 
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->atLast && pCur->info.nKey<intKey ){
      *pRes = -1;
      return SQLITE_OK;
    }
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey || pIdxKey );
  for(;;){
    int lwr, upr, idx;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    int c;

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    if( biasRight ){
      pCur->aiIdx[pCur->iPage] = (u16)(idx = upr);
    }else{
      pCur->aiIdx[pCur->iPage] = (u16)(idx = (upr+lwr)/2);
    }
    for(;;){
      u8 *pCell;                          /* Pointer to current cell in pPage */

      assert( idx==pCur->aiIdx[pCur->iPage] );
      pCur->info.nSize = 0;
      pCell = findCell(pPage, idx) + pPage->childPtrSize;
      if( pPage->intKey ){
        i64 nCellKey;
        if( pPage->hasData ){
          u32 dummy;
          pCell += getVarint32(pCell, dummy);
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey==intKey ){
          c = 0;
        }else if( nCellKey<intKey ){
          c = -1;
        }else{
          assert( nCellKey>intKey );
          c = +1;
        }
        pCur->validNKey = 1;
        pCur->info.nKey = nCellKey;
      }else{
        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        int nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload
         /* && (pCell+nCell)<pPage->aDataEnd */
        ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = sqlite3VdbeRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
          /* && (pCell+nCell+2)<=pPage->aDataEnd */
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = sqlite3VdbeRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          btreeParseCellPtr(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          pCellKey = sqlite3Malloc( nCell );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM;
            goto moveto_finish;
          }
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
      }
      if( c==0 ){
        if( pPage->intKey && !pPage->leaf ){
          lwr = idx;
          break;
        }else{
          *pRes = 0;
          rc = SQLITE_OK;
          goto moveto_finish;
        }
      }
      if( c<0 ){
        lwr = idx+1;
      }else{
        upr = idx-1;
      }
      if( lwr>upr ){
        break;
      }
      pCur->aiIdx[pCur->iPage] = (u16)(idx = (lwr+upr)/2);
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      chldPg = 0;
    }else if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    if( chldPg==0 ){
      assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    pCur->info.nSize = 0;
    pCur->validNKey = 0;
    rc = moveToChild(pCur, chldPg);
    if( rc ) goto moveto_finish;
  }
moveto_finish:
  return rc;
}